

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreBinarySerializer::NormalizeBoneWeights
          (OgreBinarySerializer *this,VertexData *vertexData)

{
  bool bVar1;
  reference puVar2;
  pointer pVVar3;
  VertexBoneAssignmentList *this_00;
  reference pVVar4;
  VertexBoneAssignment *boneAssign;
  iterator __end4;
  iterator __begin4;
  VertexBoneAssignmentList *__range4;
  __normal_iterator<const_Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
  local_c8;
  const_iterator baEnd_1;
  __normal_iterator<const_Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
  local_b8;
  const_iterator baIter_1;
  float sum;
  uint32_t vertexIndex;
  iterator __end2;
  iterator __begin2;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range2;
  float epsilon;
  __normal_iterator<Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
  local_68;
  __normal_iterator<const_Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
  local_60;
  const_iterator baEnd;
  __normal_iterator<const_Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
  local_50;
  const_iterator baIter;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> influencedVertices;
  VertexData *vertexData_local;
  OgreBinarySerializer *this_local;
  
  if ((vertexData != (VertexData *)0x0) &&
     (bVar1 = std::
              vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
              ::empty(&(vertexData->super_IVertexData).boneAssignments), !bVar1)) {
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&baIter)
    ;
    baEnd._M_current =
         (VertexBoneAssignment *)
         std::
         vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
         ::begin(&(vertexData->super_IVertexData).boneAssignments);
    __gnu_cxx::
    __normal_iterator<Assimp::Ogre::VertexBoneAssignment_const*,std::vector<Assimp::Ogre::VertexBoneAssignment,std::allocator<Assimp::Ogre::VertexBoneAssignment>>>
    ::__normal_iterator<Assimp::Ogre::VertexBoneAssignment*>
              ((__normal_iterator<Assimp::Ogre::VertexBoneAssignment_const*,std::vector<Assimp::Ogre::VertexBoneAssignment,std::allocator<Assimp::Ogre::VertexBoneAssignment>>>
                *)&local_50,
               (__normal_iterator<Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
                *)&baEnd);
    local_68._M_current =
         (VertexBoneAssignment *)
         std::
         vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
         ::end(&(vertexData->super_IVertexData).boneAssignments);
    __gnu_cxx::
    __normal_iterator<Assimp::Ogre::VertexBoneAssignment_const*,std::vector<Assimp::Ogre::VertexBoneAssignment,std::allocator<Assimp::Ogre::VertexBoneAssignment>>>
    ::__normal_iterator<Assimp::Ogre::VertexBoneAssignment*>
              ((__normal_iterator<Assimp::Ogre::VertexBoneAssignment_const*,std::vector<Assimp::Ogre::VertexBoneAssignment,std::allocator<Assimp::Ogre::VertexBoneAssignment>>>
                *)&local_60,&local_68);
    while (bVar1 = __gnu_cxx::operator!=(&local_50,&local_60), bVar1) {
      pVVar3 = __gnu_cxx::
               __normal_iterator<const_Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
               ::operator->(&local_50);
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 &baIter,&pVVar3->vertexIndex);
      __gnu_cxx::
      __normal_iterator<const_Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
      ::operator++(&local_50);
    }
    __end2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                       ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *
                        )&baIter);
    _sum = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                     ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      &baIter);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&sum), bVar1) {
      puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&__end2);
      baIter_1._M_current._4_4_ = *puVar2;
      baIter_1._M_current._0_4_ = 0.0;
      baEnd_1._M_current =
           (VertexBoneAssignment *)
           std::
           vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
           ::begin(&(vertexData->super_IVertexData).boneAssignments);
      __gnu_cxx::
      __normal_iterator<Assimp::Ogre::VertexBoneAssignment_const*,std::vector<Assimp::Ogre::VertexBoneAssignment,std::allocator<Assimp::Ogre::VertexBoneAssignment>>>
      ::__normal_iterator<Assimp::Ogre::VertexBoneAssignment*>
                ((__normal_iterator<Assimp::Ogre::VertexBoneAssignment_const*,std::vector<Assimp::Ogre::VertexBoneAssignment,std::allocator<Assimp::Ogre::VertexBoneAssignment>>>
                  *)&local_b8,
                 (__normal_iterator<Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
                  *)&baEnd_1);
      __range4 = (VertexBoneAssignmentList *)
                 std::
                 vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
                 ::end(&(vertexData->super_IVertexData).boneAssignments);
      __gnu_cxx::
      __normal_iterator<Assimp::Ogre::VertexBoneAssignment_const*,std::vector<Assimp::Ogre::VertexBoneAssignment,std::allocator<Assimp::Ogre::VertexBoneAssignment>>>
      ::__normal_iterator<Assimp::Ogre::VertexBoneAssignment*>
                ((__normal_iterator<Assimp::Ogre::VertexBoneAssignment_const*,std::vector<Assimp::Ogre::VertexBoneAssignment,std::allocator<Assimp::Ogre::VertexBoneAssignment>>>
                  *)&local_c8,
                 (__normal_iterator<Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
                  *)&__range4);
      while (bVar1 = __gnu_cxx::operator!=(&local_b8,&local_c8), bVar1) {
        pVVar3 = __gnu_cxx::
                 __normal_iterator<const_Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
                 ::operator->(&local_b8);
        if (pVVar3->vertexIndex == baIter_1._M_current._4_4_) {
          pVVar3 = __gnu_cxx::
                   __normal_iterator<const_Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
                   ::operator->(&local_b8);
          baIter_1._M_current._0_4_ = pVVar3->weight + baIter_1._M_current._0_4_;
        }
        __gnu_cxx::
        __normal_iterator<const_Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
        ::operator++(&local_b8);
      }
      if ((baIter_1._M_current._0_4_ < 0.95) || (1.05 < baIter_1._M_current._0_4_)) {
        this_00 = &(vertexData->super_IVertexData).boneAssignments;
        __end4 = std::
                 vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
                 ::begin(this_00);
        boneAssign = (VertexBoneAssignment *)
                     std::
                     vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
                     ::end(this_00);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
                                           *)&boneAssign), bVar1) {
          pVVar4 = __gnu_cxx::
                   __normal_iterator<Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
                   ::operator*(&__end4);
          if (pVVar4->vertexIndex == baIter_1._M_current._4_4_) {
            pVVar4->weight = pVVar4->weight / baIter_1._M_current._0_4_;
          }
          __gnu_cxx::
          __normal_iterator<Assimp::Ogre::VertexBoneAssignment_*,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>
          ::operator++(&__end4);
        }
      }
      std::_Rb_tree_const_iterator<unsigned_int>::operator++(&__end2);
    }
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&baIter)
    ;
  }
  return;
}

Assistant:

void OgreBinarySerializer::NormalizeBoneWeights(VertexData *vertexData) const
{
    if (!vertexData || vertexData->boneAssignments.empty())
        return;

    std::set<uint32_t> influencedVertices;
    for (VertexBoneAssignmentList::const_iterator baIter=vertexData->boneAssignments.begin(), baEnd=vertexData->boneAssignments.end(); baIter != baEnd; ++baIter) {
        influencedVertices.insert(baIter->vertexIndex);
    }

    /** Normalize bone weights.
        Some exporters won't care if the sum of all bone weights
        for a single vertex equals 1 or not, so validate here. */
    const float epsilon = 0.05f;
    for (const uint32_t vertexIndex : influencedVertices)
    {
        float sum = 0.0f;
        for (VertexBoneAssignmentList::const_iterator baIter=vertexData->boneAssignments.begin(), baEnd=vertexData->boneAssignments.end(); baIter != baEnd; ++baIter)
        {
            if (baIter->vertexIndex == vertexIndex)
                sum += baIter->weight;
        }
        if ((sum < (1.0f - epsilon)) || (sum > (1.0f + epsilon)))
        {
            for (auto &boneAssign : vertexData->boneAssignments)
            {
                if (boneAssign.vertexIndex == vertexIndex)
                    boneAssign.weight /= sum;
            }
        }
    }
}